

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.cpp
# Opt level: O0

void __thiscall libtorrent::dht::bootstrap::done(bootstrap *this)

{
  bool bVar1;
  uint32_t uVar2;
  node *pnVar3;
  dht_observer *pdVar4;
  vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
  *this_00;
  element_type *peVar5;
  endpoint local_50;
  undefined1 local_33;
  uchar local_32;
  bitfield_flag local_31;
  __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_30
  ;
  shared_ptr<libtorrent::dht::observer> *o;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
  *__range2;
  bootstrap *this_local;
  
  pnVar3 = traversal_algorithm::get_node((traversal_algorithm *)this);
  pdVar4 = dht::node::observer(pnVar3);
  uVar2 = traversal_algorithm::id((traversal_algorithm *)this);
  (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
            (pdVar4,4,"[%u] bootstrap done, pinging remaining nodes",(ulong)uVar2);
  this_00 = &(this->super_get_peers).super_find_data.super_traversal_algorithm.m_results;
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ::begin(this_00);
  o = (shared_ptr<libtorrent::dht::observer> *)
      ::std::
      vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                                     *)&o), bVar1) {
    local_30 = (__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                  ::operator*(&__end2);
    peVar5 = ::std::
             __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_30);
    local_32 = (peVar5->flags).m_val;
    local_33 = 1;
    local_31 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)
                          local_32,(bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                                    )0x1);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_31);
    if (!bVar1) {
      pnVar3 = (this->super_get_peers).super_find_data.super_traversal_algorithm.m_node;
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_30);
      observer::target_ep(&local_50,peVar5);
      dht::node::add_node(pnVar3,&local_50);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
    ::operator++(&__end2);
  }
  find_data::done((find_data *)this);
  return;
}

Assistant:

void bootstrap::done()
{
#ifndef TORRENT_DISABLE_LOGGING
	get_node().observer()->log(dht_logger::traversal, "[%u] bootstrap done, pinging remaining nodes"
		, id());
#endif

	for (auto const& o : m_results)
	{
		if (o->flags & observer::flag_queried) continue;
		// this will send a ping
		m_node.add_node(o->target_ep());
	}
	get_peers::done();
}